

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_ManFindCofVar(word *pTruth,int nWords,int nVars)

{
  int iVar1;
  int local_22c;
  int iVar;
  word uTruthCof [64];
  int nVars_local;
  int nWords_local;
  word *pTruth_local;
  
  local_22c = 0;
  do {
    if (nVars <= local_22c) {
      return -1;
    }
    Abc_TtCofactor0p((word *)&stack0xfffffffffffffdd8,pTruth,nWords,local_22c);
    iVar1 = Abc_TtSupportSize((word *)&stack0xfffffffffffffdd8,nVars);
    if (1 < iVar1) {
      Abc_TtCofactor1p((word *)&stack0xfffffffffffffdd8,pTruth,nWords,local_22c);
      iVar1 = Abc_TtSupportSize((word *)&stack0xfffffffffffffdd8,nVars);
      if (1 < iVar1) {
        return local_22c;
      }
    }
    local_22c = local_22c + 1;
  } while( true );
}

Assistant:

static inline int Lf_ManFindCofVar( word * pTruth, int nWords, int nVars )
{
    word uTruthCof[LF_TT_WORDS]; int iVar;
    for ( iVar = 0; iVar < nVars; iVar++ )
    {
        Abc_TtCofactor0p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        Abc_TtCofactor1p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        return iVar;
    }
    return -1;
}